

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask12_16(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  vpmovsxbd_avx(ZEXT416(0x281c1408));
  uVar1 = in[0xb];
  uVar2 = in[0xc];
  uVar3 = in[0xd];
  uVar4 = in[0xf];
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[3] << 4)));
  vpmovsxbd_avx(ZEXT416(0x24181004));
  auVar5 = vpsllvd_avx2(auVar7,_DAT_0019cc50);
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)auVar7._4_4_));
  auVar6 = vpsllvd_avx2(auVar8,_DAT_0019cc40);
  auVar8 = vpinsrd_avx(ZEXT416(*in),auVar7._0_4_ >> 8 | in[3] << 4,1);
  auVar8 = vpinsrd_avx(auVar8,auVar7._4_4_ >> 4,2);
  auVar8 = vpinsrd_avx(auVar8,in[8],3);
  auVar8 = vpternlogd_avx512vl(auVar5,auVar6,auVar8,0xfe);
  *(undefined1 (*) [16])out = auVar8;
  out[4] = uVar3 << 0x1c | uVar2 << 0x10 | uVar1 << 4 | auVar7._12_4_ >> 8;
  out[5] = uVar4 << 0x14 | in[0xe] << 8 | uVar3 >> 4;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask12_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;

  return out;
}